

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_json_transaction.cpp
# Opt level: O2

ByteData *
cfd::api::json::TransactionJsonApi::ConvertSignDataToSignature
          (ByteData *__return_storage_ptr__,string *hex_string,bool is_sign,bool is_der_encode,
          string *sighash_type,bool sighash_anyone_can_pay)

{
  CfdException *this;
  undefined3 in_register_00000009;
  undefined7 in_register_00000011;
  undefined1 local_60 [36];
  SigHashType sighashtype;
  
  cfd::core::ByteData::ByteData(__return_storage_ptr__);
  if (((uint)CONCAT71(in_register_00000011,is_sign) & CONCAT31(in_register_00000009,is_der_encode))
      == 1) {
    if (hex_string->_M_string_length == 0) {
      local_60._0_8_ = "cfd_json_transaction.cpp";
      local_60._8_4_ = 0xaa;
      local_60._16_8_ = "ConvertSignDataToSignature";
      core::logger::warn<>
                ((CfdSourceLocation *)local_60,"Failed to AddMultisigSign. sign hex empty.");
      this = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_60,"Invalid hex string. empty sign hex.",(allocator *)&sighashtype)
      ;
      core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_60);
      __cxa_throw(this,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    ConvertSigHashType((TransactionJsonApi *)&sighashtype,sighash_type,sighash_anyone_can_pay);
    cfd::core::CryptoUtil::ConvertSignatureToDer((string *)local_60,(SigHashType *)hex_string);
  }
  else {
    if (hex_string->_M_string_length == 0) {
      return __return_storage_ptr__;
    }
    cfd::core::ByteData::ByteData((ByteData *)local_60,(string *)hex_string);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&__return_storage_ptr__->data_,
             (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  return __return_storage_ptr__;
}

Assistant:

ByteData TransactionJsonApi::ConvertSignDataToSignature(
    const std::string& hex_string, bool is_sign, bool is_der_encode,
    const std::string& sighash_type, bool sighash_anyone_can_pay) {
  ByteData byte_data;
  if (is_sign && is_der_encode) {
    if (hex_string.empty()) {
      warn(CFD_LOG_SOURCE, "Failed to AddMultisigSign. sign hex empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid hex string. empty sign hex.");
    }
    SigHashType sighashtype = TransactionJsonApi::ConvertSigHashType(
        sighash_type, sighash_anyone_can_pay);
    byte_data = CryptoUtil::ConvertSignatureToDer(hex_string, sighashtype);
  } else if (hex_string.empty()) {
    // do nothing
  } else {
    byte_data = ByteData(hex_string);
  }
  return byte_data;
}